

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O0

void __thiscall ExtraData::printExtraData(ExtraData *this)

{
  value_type vVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  reference pvVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_6e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_6d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_6b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_6a0;
  int local_684;
  undefined1 local_680 [4];
  int i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_668;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_650;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_638;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_620;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_608;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_590;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_578;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_560;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_548;
  undefined1 local_530 [296];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_408;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3a8;
  int local_38c;
  undefined1 local_388 [4];
  int i;
  Utils local_370 [32];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_350;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_338;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_320;
  int local_304;
  undefined1 local_300 [4];
  int j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2b8;
  Utils local_2a0 [32];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_280;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_268;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_250;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_238;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_220;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_208;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_190;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_160;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_148;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_130;
  uint local_118;
  uint local_114;
  int width;
  int height;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  ExtraData *local_10;
  ExtraData *this_local;
  
  local_10 = this;
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "_______________________ExtraData_________________________");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  if ((this->consolePropsIsSet & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"CONSOLE_PROP: ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_28,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    uVar2 = Utils::lenFourBytes(&local_28);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    poVar4 = std::operator<<(poVar4," bytes");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"This value MUST be 204.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_28);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_50,&(this->CONSOLE_PROPS).BlockSignature);
    Utils::print_vec(&local_50);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_50);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_)
    ;
    poVar4 = std::operator<<(poVar4,"This value MUST be 0xA0000002.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"   FillAttributes:                  ");
    parseFillAttributes(this,false);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"   PopupFillAttributes:             ");
    parseFillAttributes(this,true);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"   ScreenBufferSizeX:               ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_68,&(this->CONSOLE_PROPS).ScreenBufferSizeX);
    iVar3 = Utils::lenTwoBytes(&local_68);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4," characters");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_68);
    poVar4 = std::operator<<((ostream *)&std::cout,"   ScreenBufferSizeY:               ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_80,&(this->CONSOLE_PROPS).ScreenBufferSizeY);
    iVar3 = Utils::lenTwoBytes(&local_80);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4," characters");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_80);
    poVar4 = std::operator<<((ostream *)&std::cout,"   WindowSizeX:                     ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_98,&(this->CONSOLE_PROPS).WindowSizeX);
    iVar3 = Utils::lenTwoBytes(&local_98);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4," characters");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_98);
    poVar4 = std::operator<<((ostream *)&std::cout,"   WindowSizeY:                     ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_b0,&(this->CONSOLE_PROPS).WindowSizeY);
    iVar3 = Utils::lenTwoBytes(&local_b0);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4," characters");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_b0);
    poVar4 = std::operator<<((ostream *)&std::cout,"   WindowOriginX:                   ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_c8,&(this->CONSOLE_PROPS).WindowOriginX);
    iVar3 = Utils::lenTwoBytes(&local_c8);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4," pixels");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_c8);
    poVar4 = std::operator<<((ostream *)&std::cout,"   WindowOriginY:                   ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_e0,&(this->CONSOLE_PROPS).WindowOriginY);
    iVar3 = Utils::lenTwoBytes(&local_e0);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4," pixels");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_e0);
    std::operator<<((ostream *)&std::cout,"   UNUSED1:                         ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_f8,&(this->CONSOLE_PROPS).UNUSED1);
    Utils::print_vec(&local_f8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_f8);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_)
    ;
    poVar4 = std::operator<<(poVar4,"A value that is undefined and MUST be ignored.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"   UNUSED2:                         ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&width,
               &(this->CONSOLE_PROPS).UNUSED2);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&width);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&width);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_)
    ;
    poVar4 = std::operator<<(poVar4,"A value that is undefined and MUST be ignored.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"   FontSize:                        ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_00 = &(this->CONSOLE_PROPS).FontSize;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,0);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,1);
    local_114 = vVar1 << 8 | *pvVar5;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,2);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,3);
    local_118 = vVar1 << 8 | *pvVar5;
    poVar4 = std::operator<<((ostream *)&std::cout,"       Font height:                 ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_114);
    poVar4 = std::operator<<(poVar4," pixels");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"       Font width:                  ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_118);
    poVar4 = std::operator<<(poVar4," pixels");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"   FontFamily:                      ");
    parseFontFamily(this);
    std::operator<<((ostream *)&std::cout,"   FontWeight:                      ");
    parseFontWeight(this);
    std::operator<<((ostream *)&std::cout,"   FaceName:                        ");
    Utils::print_vec_unicode(&(this->CONSOLE_PROPS).FaceName);
    std::operator<<((ostream *)&std::cout,"   CursorSize:                      ");
    parseCursorSize(this);
    std::operator<<((ostream *)&std::cout,"   FullScreen:                      ");
    parseFullScreen(this);
    std::operator<<((ostream *)&std::cout,"   QuickEdit:                       ");
    parseQuickEdit(this);
    std::operator<<((ostream *)&std::cout,"   InsertMode:                      ");
    parseInsertMode(this);
    std::operator<<((ostream *)&std::cout,"   AutoPosition:                    ");
    parseAutoPosition(this);
    poVar4 = std::operator<<((ostream *)&std::cout,"   HistoryBufferSize:               ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_130,&(this->CONSOLE_PROPS).HistoryBufferSize);
    uVar2 = Utils::lenFourBytes(&local_130);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    poVar4 = std::operator<<(poVar4," characters");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_130);
    poVar4 = std::operator<<((ostream *)&std::cout,"   NumberOfHistoryBuffers:          ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_148,&(this->CONSOLE_PROPS).NumberOfHistoryBuffers);
    uVar2 = Utils::lenFourBytes(&local_148);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_148);
    std::operator<<((ostream *)&std::cout,"   HistoryNoDup:                    ");
    parseHistoryNoDup(this);
    std::operator<<((ostream *)&std::cout,"   ColorTable:                      ");
    parseColorTable(this);
  }
  if ((this->consoleFEIsSet & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"CONSOLE_FE_PROPS: ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_160,&(this->CONSOLE_FE_PROPS).BlockSize);
    uVar2 = Utils::lenFourBytes(&local_160);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    poVar4 = std::operator<<(poVar4," bytes");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"This value MUST be 12.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_160);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_178,&(this->CONSOLE_FE_PROPS).BlockSignature);
    Utils::print_vec(&local_178);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_178);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_)
    ;
    poVar4 = std::operator<<(poVar4,"This value MUST be 0xA0000004.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"   CodePage:                        ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_190,&(this->CONSOLE_FE_PROPS).CodePage);
    Utils::print_vec(&local_190);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_190);
  }
  if ((this->drownPropsIsSet & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"DARWIN_PROPS: ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_1a8,&(this->DARWIN_PROPS).BlockSize);
    uVar2 = Utils::lenFourBytes(&local_1a8);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    poVar4 = std::operator<<(poVar4," bytes");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"This value MUST be 788.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1a8);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_1c0,&(this->DARWIN_PROPS).BlockSignature);
    Utils::print_vec(&local_1c0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1c0);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_)
    ;
    poVar4 = std::operator<<(poVar4,"This value MUST be 0xA0000006.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"   DarwinDataAnsi:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_1d8,&(this->DARWIN_PROPS).DarwinDataAnsi);
    Utils::print_vec(&local_1d8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1d8);
    std::operator<<((ostream *)&std::cout,"   DarwinDataUnicode:               ");
    Utils::print_vec_unicode(&(this->DARWIN_PROPS).DarwinDataUnicode);
  }
  if ((this->environmentPropsIsSet & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"ENVIRONMENT_PROPS: ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_1f0,&(this->ENVIRONMENT_PROPS).BlockSize);
    uVar2 = Utils::lenFourBytes(&local_1f0);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    poVar4 = std::operator<<(poVar4," bytes");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"This value MUST be 788.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1f0);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_208,&(this->ENVIRONMENT_PROPS).BlockSignature);
    Utils::print_vec(&local_208);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_208);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_)
    ;
    poVar4 = std::operator<<(poVar4,"This value MUST be 0xA0000001.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"   TargetAnsi:                      ");
    Utils::print_vec_unicode(&(this->ENVIRONMENT_PROPS).TargetAnsi);
    std::operator<<((ostream *)&std::cout,"   TargetUnicode:                   ");
    Utils::print_vec_unicode(&(this->ENVIRONMENT_PROPS).TargetUnicode);
  }
  if ((this->iconEnvironmentPropsIsSet & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"ICON_ENVIRONMENT_PROPS: ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_220,&(this->ICON_ENVIRONMENT_PROPS).BlockSize);
    uVar2 = Utils::lenFourBytes(&local_220);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    poVar4 = std::operator<<(poVar4," bytes");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"This value MUST be 788.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_220);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_238,&(this->ICON_ENVIRONMENT_PROPS).BlockSignature);
    Utils::print_vec(&local_238);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_238);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_)
    ;
    poVar4 = std::operator<<(poVar4,"This value MUST be 0xA0000007.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"   TargetAnsi:                      ");
    Utils::print_vec_unicode(&(this->ICON_ENVIRONMENT_PROPS).TargetAnsi);
    std::operator<<((ostream *)&std::cout,"   TargetUnicode:                   ");
    Utils::print_vec_unicode(&(this->ICON_ENVIRONMENT_PROPS).TargetUnicode);
  }
  if ((this->knownFolderPropsIsSet & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"KNOWN_FOLDER_PROPS: ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_250,&(this->KNOWN_FOLDER_PROPS).BlockSize);
    uVar2 = Utils::lenFourBytes(&local_250);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    poVar4 = std::operator<<(poVar4," bytes");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"This value MUST be 28.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_250);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_268,&(this->KNOWN_FOLDER_PROPS).BlockSignature);
    Utils::print_vec(&local_268);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_268);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_)
    ;
    poVar4 = std::operator<<(poVar4,"This value MUST be 0xA000000B.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"   KnownFolderID:                   ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_280,&(this->KNOWN_FOLDER_PROPS).KnownFolderID);
    Utils::printSid(&local_280,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_280);
    poVar4 = std::operator<<((ostream *)&std::cout," : ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_2b8,&(this->KNOWN_FOLDER_PROPS).KnownFolderID);
    Utils::getClsidType_abi_cxx11_(local_2a0,&local_2b8);
    poVar4 = std::operator<<(poVar4,(string *)local_2a0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_2a0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_2b8);
    poVar4 = std::operator<<((ostream *)&std::cout,"   Offset:                          ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_2d0,&(this->KNOWN_FOLDER_PROPS).Offset);
    uVar2 = Utils::lenFourBytes(&local_2d0);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    poVar4 = std::operator<<(poVar4," bytes.");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,
                             "Specifies the location of the ItemID of the first child segment of the IDList specified by KnownFolderID. "
                            );
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,
                             "This value is the offset, in bytes, into the link target IDList.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_2d0);
  }
  if ((this->propertyStorePropsIsSet & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"PROPERTY_STORE_PROPS: ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_2e8,&(this->PROPERTY_STORE_PROPS).BlockSize);
    uVar2 = Utils::lenFourBytes(&local_2e8);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    poVar4 = std::operator<<(poVar4," bytes");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"This value MUST be greater than or equal to 12.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_2e8);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_300,
               &(this->PROPERTY_STORE_PROPS).BlockSignature);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_300);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_300);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_)
    ;
    poVar4 = std::operator<<(poVar4,"This value MUST be 0xA0000009.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"   PropertyStore:                   ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_304 = 0;
    while( true ) {
      uVar6 = (ulong)local_304;
      sVar7 = std::
              vector<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
              ::size(&(this->PROPERTY_STORE_PROPS).PropertyStore);
      if (sVar7 <= uVar6) break;
      poVar4 = std::operator<<((ostream *)&std::cout,"   Serialized Property Storage ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_304 + 1);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"          StorageSize:              ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
      pvVar8 = std::
               vector<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
               ::operator[](&(this->PROPERTY_STORE_PROPS).PropertyStore,(long)local_304);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_320,&pvVar8->StorageSize);
      uVar2 = Utils::lenFourBytes(&local_320);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
      poVar4 = std::operator<<(poVar4," bytes");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_320);
      std::operator<<((ostream *)&std::cout,"          Version:                  ");
      pvVar8 = std::
               vector<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
               ::operator[](&(this->PROPERTY_STORE_PROPS).PropertyStore,(long)local_304);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_338,&pvVar8->Version);
      Utils::print_vec(&local_338);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_338);
      poVar4 = std::operator<<((ostream *)&std::cout,
                               (string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"Has to be equal to 0x53505331.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::cout,"          FormatID:                 ");
      pvVar8 = std::
               vector<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
               ::operator[](&(this->PROPERTY_STORE_PROPS).PropertyStore,(long)local_304);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_350,&pvVar8->FormatID)
      ;
      Utils::printSid(&local_350,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_350);
      poVar4 = std::operator<<((ostream *)&std::cout," : ");
      pvVar8 = std::
               vector<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
               ::operator[](&(this->PROPERTY_STORE_PROPS).PropertyStore,(long)local_304);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_388,&pvVar8->FormatID)
      ;
      Utils::getClsidType_abi_cxx11_
                (local_370,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_388);
      poVar4 = std::operator<<(poVar4,(string *)local_370);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_370);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_388);
      local_38c = 0;
      while( true ) {
        uVar6 = (ulong)local_38c;
        pvVar8 = std::
                 vector<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                 ::operator[](&(this->PROPERTY_STORE_PROPS).PropertyStore,(long)local_304);
        sVar7 = std::
                vector<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                ::size(&pvVar8->SerializedPropertyValue);
        if (sVar7 <= uVar6) break;
        poVar4 = std::operator<<((ostream *)&std::cout,"          SerializedPropertyValue ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_38c + 1);
        poVar4 = std::operator<<(poVar4,":");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,"            ValueSize:              ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
        pvVar8 = std::
                 vector<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                 ::operator[](&(this->PROPERTY_STORE_PROPS).PropertyStore,(long)local_304);
        pvVar9 = std::
                 vector<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                 ::operator[](&pvVar8->SerializedPropertyValue,(long)local_38c);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_3a8,&pvVar9->ValueSize);
        uVar2 = Utils::lenFourBytes(&local_3a8);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
        poVar4 = std::operator<<(poVar4," bytes");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_3a8);
        if ((this->isStringNameStructInPropsStorage & 1U) == 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"            Id:                     ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
          pvVar8 = std::
                   vector<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                   ::operator[](&(this->PROPERTY_STORE_PROPS).PropertyStore,(long)local_304);
          pvVar9 = std::
                   vector<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                   ::operator[](&pvVar8->SerializedPropertyValue,(long)local_38c);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_3d8,&pvVar9->NameSizeOrId);
          uVar2 = Utils::lenFourBytes(&local_3d8);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_3d8);
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cout,"            NameSize:               ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
          pvVar8 = std::
                   vector<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                   ::operator[](&(this->PROPERTY_STORE_PROPS).PropertyStore,(long)local_304);
          pvVar9 = std::
                   vector<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                   ::operator[](&pvVar8->SerializedPropertyValue,(long)local_38c);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_3c0,&pvVar9->NameSizeOrId);
          uVar2 = Utils::lenFourBytes(&local_3c0);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
          poVar4 = std::operator<<(poVar4," bytes");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_3c0);
        }
        std::operator<<((ostream *)&std::cout,"            Reserved:               ");
        pvVar8 = std::
                 vector<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                 ::operator[](&(this->PROPERTY_STORE_PROPS).PropertyStore,(long)local_304);
        pvVar9 = std::
                 vector<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                 ::operator[](&pvVar8->SerializedPropertyValue,(long)local_38c);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_3f0,&pvVar9->Reserved);
        Utils::print_vec(&local_3f0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_3f0);
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 (string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
        poVar4 = std::operator<<(poVar4,"MUST be 0x00.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        if ((this->isStringNameStructInPropsStorage & 1U) != 0) {
          std::operator<<((ostream *)&std::cout,"            Name:               ");
          pvVar8 = std::
                   vector<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                   ::operator[](&(this->PROPERTY_STORE_PROPS).PropertyStore,(long)local_304);
          pvVar9 = std::
                   vector<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                   ::operator[](&pvVar8->SerializedPropertyValue,(long)local_38c);
          Utils::print_vec_unicode(&pvVar9->Name);
        }
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "            Value (TypedPropertyValue structure):");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::operator<<((ostream *)&std::cout,"              Type:                 ");
        pvVar8 = std::
                 vector<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                 ::operator[](&(this->PROPERTY_STORE_PROPS).PropertyStore,(long)local_304);
        pvVar9 = std::
                 vector<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                 ::operator[](&pvVar8->SerializedPropertyValue,(long)local_38c);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_408,&(pvVar9->Value).Type);
        uVar2 = Utils::vectTwoToUnsignedInt(&local_408,0);
        pvVar8 = std::
                 vector<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                 ::operator[](&(this->PROPERTY_STORE_PROPS).PropertyStore,(long)local_304);
        pvVar9 = std::
                 vector<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                 ::operator[](&pvVar8->SerializedPropertyValue,(long)local_38c);
        PropertyStorePropsStruct::StringOrIntegerName::TypedPropertyValue::TypedPropertyValue
                  ((TypedPropertyValue *)(local_530 + 0xe0),&pvVar9->Value);
        parseTypedPropertyValueTypeAndValue
                  (this,true,uVar2,(TypedPropertyValue *)(local_530 + 0xe0));
        PropertyStorePropsStruct::StringOrIntegerName::TypedPropertyValue::~TypedPropertyValue
                  ((TypedPropertyValue *)(local_530 + 0xe0));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_408);
        std::operator<<((ostream *)&std::cout,"              Padding:              ");
        pvVar8 = std::
                 vector<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                 ::operator[](&(this->PROPERTY_STORE_PROPS).PropertyStore,(long)local_304);
        pvVar9 = std::
                 vector<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                 ::operator[](&pvVar8->SerializedPropertyValue,(long)local_38c);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 200),
                   &(pvVar9->Value).Padding);
        Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 200));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 200));
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 (string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
        poVar4 = std::operator<<(poVar4,
                                 "MUST be set to zero, and any nonzero value SHOULD be rejected.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        local_38c = local_38c + 1;
      }
      std::operator<<((ostream *)&std::cout,"          TerminalIdentifier:       ");
      pvVar8 = std::
               vector<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
               ::operator[](&(this->PROPERTY_STORE_PROPS).PropertyStore,(long)local_304);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 0xb0),
                 &pvVar8->TerminalIdentifier);
      Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 0xb0));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 0xb0));
      local_304 = local_304 + 1;
    }
    std::operator<<((ostream *)&std::cout,"   TerminalId:                      ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 0x98),
               &(this->PROPERTY_STORE_PROPS).TerminalId);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 0x98));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 0x98));
  }
  if ((this->shimPropsIsSet & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"SHIM_PROPS: ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 0x80),
               &(this->SHIM_PROPS).BlockSize);
    uVar2 = Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                (local_530 + 0x80));
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    poVar4 = std::operator<<(poVar4," bytes");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"This value MUST be greater than or equal to 136.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 0x80));
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 0x68),
               &(this->SHIM_PROPS).BlockSignature);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 0x68));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 0x68));
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_)
    ;
    poVar4 = std::operator<<(poVar4,"This value MUST be 0xA0000008.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"   LayerName:                       ");
    Utils::print_vec_unicode(&(this->SHIM_PROPS).LayerName);
  }
  if ((this->sFolderPropsIsSet & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"SPECIAL_FOLDER_PROPS: ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 0x50),
               &(this->SPECIAL_FOLDER_PROPS).BlockSize);
    uVar2 = Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                (local_530 + 0x50));
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    poVar4 = std::operator<<(poVar4," bytes");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"This value MUST be 16.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 0x50));
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 0x38),
               &(this->SPECIAL_FOLDER_PROPS).BlockSignature);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 0x38));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 0x38));
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_)
    ;
    poVar4 = std::operator<<(poVar4,"This value MUST be 0xA0000005.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"   SpecialFolderID:                 ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 0x20),
               &(this->SPECIAL_FOLDER_PROPS).SpecialFolderID);
    uVar2 = Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                (local_530 + 0x20));
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    poVar4 = std::operator<<(poVar4," : ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_548,&(this->SPECIAL_FOLDER_PROPS).SpecialFolderID);
    Utils::vectFourBytesToUnsignedInt(&local_548,0);
    getSpecialFolderType_abi_cxx11_((ExtraData *)local_530,(uint)this);
    poVar4 = std::operator<<(poVar4,(string *)local_530);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_530);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_548);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_530 + 0x20));
    poVar4 = std::operator<<((ostream *)&std::cout,"   Offset:                          ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_560,&(this->SPECIAL_FOLDER_PROPS).Offset);
    uVar2 = Utils::lenFourBytes(&local_560);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    poVar4 = std::operator<<(poVar4," bytes.");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,
                             "Specifies the location of the ItemID of the first child segment of the IDList specified by SpecialFolderID. "
                            );
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,
                             "This value is the offset, in bytes, into the link target IDList.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_560);
  }
  if ((this->trackerPropsIsSet & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"TRACKER_PROPS: ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_578,&(this->TRACKER_PROPS).BlockSize);
    uVar2 = Utils::lenFourBytes(&local_578);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    poVar4 = std::operator<<(poVar4," bytes");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"This value MUST be 96.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_578);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_590,&(this->TRACKER_PROPS).BlockSignature);
    Utils::print_vec(&local_590);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_590);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_)
    ;
    poVar4 = std::operator<<(poVar4,"This value MUST be 0xA0000003.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"   Length:                          ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_5a8,&(this->TRACKER_PROPS).Length);
    uVar2 = Utils::lenFourBytes(&local_5a8);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    poVar4 = std::operator<<(poVar4," bytes");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"This value MUST be 88 bytes.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_5a8);
    poVar4 = std::operator<<((ostream *)&std::cout,"   Version:                         ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_5c0,&(this->TRACKER_PROPS).Version);
    uVar2 = Utils::lenFourBytes(&local_5c0);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_5c0);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_)
    ;
    poVar4 = std::operator<<(poVar4,"This value MUST be 0.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"   MachineID (NetBIOS name):        ");
    Utils::print_vec_unicode(&(this->TRACKER_PROPS).MachineID);
    poVar4 = std::operator<<((ostream *)&std::cout,"   Droid:                           ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"     Droid volume identifier:       ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_5d8,&(this->TRACKER_PROPS).Droid);
    Utils::printSid(&local_5d8,0x10);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_5d8);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"     Droid file identifier:         ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_5f0,&(this->TRACKER_PROPS).Droid);
    Utils::printSid(&local_5f0,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_5f0);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"     UUID Sequence number:          ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_608,&(this->TRACKER_PROPS).Droid);
    uVar2 = Utils::vectTwoToUnsignedInt(&local_608,0x18);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_608);
    std::operator<<((ostream *)&std::cout,"     Mac address:                   ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_620,&(this->TRACKER_PROPS).Droid);
    Utils::printMacAddr(&local_620,0x10);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_620);
    poVar4 = std::operator<<((ostream *)&std::cout,"   DroidBirth:                      ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"     Birth droid volume identifier: ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_638,&(this->TRACKER_PROPS).DroidBirth);
    Utils::printSid(&local_638,0x10);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_638);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"     Birth droid file identifier:   ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_650,&(this->TRACKER_PROPS).DroidBirth);
    Utils::printSid(&local_650,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_650);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  if ((this->vistaAndAboveIDListPropsIsSet & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"VISTA_AND_ABOVE_IDLIST_PROPS: ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_668,&(this->VISTA_AND_ABOVE_IDLIST_PROPS).BlockSize);
    uVar2 = Utils::lenFourBytes(&local_668);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    poVar4 = std::operator<<(poVar4," bytes");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"This value MUST be greater than or equal to 10.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_668);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_680,
               &(this->VISTA_AND_ABOVE_IDLIST_PROPS).BlockSignature);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_680);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_680);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_)
    ;
    poVar4 = std::operator<<(poVar4,"This value MUST be 0xA000000C.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"   IDList: ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_684 = 0;
    while( true ) {
      uVar6 = (ulong)local_684;
      sVar7 = std::
              vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>::
              size(&(this->VISTA_AND_ABOVE_IDLIST_PROPS).IDList);
      if (sVar7 <= uVar6) break;
      poVar4 = std::operator<<((ostream *)&std::cout,"       ItemID ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_684 + 1);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"           ItemIDSize:              ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::dec);
      pvVar10 = std::
                vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
                ::operator[](&(this->VISTA_AND_ABOVE_IDLIST_PROPS).IDList,(long)local_684);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_6a0,&pvVar10->ItemIDSize);
      iVar3 = Utils::lenTwoBytes(&local_6a0);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      poVar4 = std::operator<<(poVar4," bytes");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_6a0);
      std::operator<<((ostream *)&std::cout,"           Data:                    ");
      pvVar10 = std::
                vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
                ::operator[](&(this->VISTA_AND_ABOVE_IDLIST_PROPS).IDList,(long)local_684);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_6b8,&pvVar10->Data);
      Utils::parseItemData(&local_6b8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_6b8);
      local_684 = local_684 + 1;
    }
    std::operator<<((ostream *)&std::cout,"           TerminalID:              ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_6d0,&(this->VISTA_AND_ABOVE_IDLIST_PROPS).TerminalID);
    Utils::print_vec(&local_6d0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_6d0);
  }
  std::operator<<((ostream *)&std::cout,"TerminalBlock:                      ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_6e8,&this->TerminalBlock);
  Utils::print_vec(&local_6e8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_6e8);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "_________________________________________________________");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ExtraData::printExtraData() {
    cout << "_______________________ExtraData_________________________" << endl;

    if (consolePropsIsSet) {
        /* CONSOLE_PROPS struct*/
        cout << "CONSOLE_PROP: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(CONSOLE_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 204." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(CONSOLE_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000002." << endl;
        cout << "   FillAttributes:                  "; ExtraData::parseFillAttributes(false); cout << endl;
        cout << "   PopupFillAttributes:             "; ExtraData::parseFillAttributes(true); cout << endl;
        cout << "   ScreenBufferSizeX:               " << dec << Utils::lenTwoBytes(CONSOLE_PROPS.ScreenBufferSizeX) << " characters" << endl;
        cout << "   ScreenBufferSizeY:               " << dec << Utils::lenTwoBytes(CONSOLE_PROPS.ScreenBufferSizeY) << " characters" << endl;
        cout << "   WindowSizeX:                     " << dec << Utils::lenTwoBytes(CONSOLE_PROPS.WindowSizeX) << " characters" << endl;
        cout << "   WindowSizeY:                     " << dec << Utils::lenTwoBytes(CONSOLE_PROPS.WindowSizeY) << " characters" << endl;
        cout << "   WindowOriginX:                   " << dec << Utils::lenTwoBytes(CONSOLE_PROPS.WindowOriginX) << " pixels" << endl;
        cout << "   WindowOriginY:                   " << dec << Utils::lenTwoBytes(CONSOLE_PROPS.WindowOriginY) << " pixels" << endl;
        cout << "   UNUSED1:                         "; Utils::print_vec(CONSOLE_PROPS.UNUSED1);
            cout << Utils::defaultOffsetDocInfo << "A value that is undefined and MUST be ignored." << endl;
        cout << "   UNUSED2:                         "; Utils::print_vec(CONSOLE_PROPS.UNUSED2);
            cout << Utils::defaultOffsetDocInfo << "A value that is undefined and MUST be ignored." << endl;
       cout << "   FontSize:                        " << endl;
            int height  = ((CONSOLE_PROPS.FontSize[0] << 8) | CONSOLE_PROPS.FontSize[1]);
            int width = ((CONSOLE_PROPS.FontSize[2] << 8) | CONSOLE_PROPS.FontSize[3]);
            cout << "       Font height:                 " << dec << height << " pixels" << endl;
            cout << "       Font width:                  " << dec << width << " pixels" << endl;
        cout << "   FontFamily:                      "; ExtraData::parseFontFamily();
        cout << "   FontWeight:                      "; ExtraData::parseFontWeight();
        cout << "   FaceName:                        "; Utils::print_vec_unicode(CONSOLE_PROPS.FaceName);
        cout << "   CursorSize:                      "; ExtraData::parseCursorSize();
        cout << "   FullScreen:                      "; ExtraData::parseFullScreen();
        cout << "   QuickEdit:                       "; ExtraData::parseQuickEdit();
        cout << "   InsertMode:                      "; ExtraData::parseInsertMode();
        cout << "   AutoPosition:                    "; ExtraData::parseAutoPosition();
        cout << "   HistoryBufferSize:               " << dec << Utils::lenFourBytes(CONSOLE_PROPS.HistoryBufferSize) << " characters" << endl;
        cout << "   NumberOfHistoryBuffers:          " << dec << Utils::lenFourBytes(CONSOLE_PROPS.NumberOfHistoryBuffers) << endl;
        cout << "   HistoryNoDup:                    "; ExtraData::parseHistoryNoDup();
        // Сделан просто вывод в hex формате без перевода в название цвета (не понятно, почему 16 записеё и по 4 байта)
        cout << "   ColorTable:                      "; ExtraData::parseColorTable();
    }
    if (consoleFEIsSet) {
        /* CONSOLE_FE_PROPS struct*/
        cout << "CONSOLE_FE_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(CONSOLE_FE_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 12." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(CONSOLE_FE_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000004." << endl;
        cout << "   CodePage:                        "; Utils::print_vec(CONSOLE_FE_PROPS.CodePage);
    }
    if (drownPropsIsSet) {
        /* DARWIN_PROPS struct*/
        cout << "DARWIN_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(DARWIN_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 788." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(DARWIN_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000006." << endl;
        cout << "   DarwinDataAnsi:                  "; Utils::print_vec(DARWIN_PROPS.DarwinDataAnsi);
        cout << "   DarwinDataUnicode:               "; Utils::print_vec_unicode(DARWIN_PROPS.DarwinDataUnicode);
    }
    if (environmentPropsIsSet) {
        /* ENVIRONMENT_PROPS struct*/
        cout << "ENVIRONMENT_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(ENVIRONMENT_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 788." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(ENVIRONMENT_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000001." << endl;
        cout << "   TargetAnsi:                      "; Utils::print_vec_unicode(ENVIRONMENT_PROPS.TargetAnsi);
        cout << "   TargetUnicode:                   "; Utils::print_vec_unicode(ENVIRONMENT_PROPS.TargetUnicode);
    }
    if (iconEnvironmentPropsIsSet) { // Проверена
        /* ICON_ENVIRONMENT_PROPS struct*/
        cout << "ICON_ENVIRONMENT_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(ICON_ENVIRONMENT_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 788." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(ICON_ENVIRONMENT_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000007." << endl;
        cout << "   TargetAnsi:                      "; Utils::print_vec_unicode(ICON_ENVIRONMENT_PROPS.TargetAnsi);
        cout << "   TargetUnicode:                   "; Utils::print_vec_unicode(ICON_ENVIRONMENT_PROPS.TargetUnicode);
    }
    if (knownFolderPropsIsSet) { //Проверена
        /* KNOWN_FOLDER_PROPS struct*/
        cout << "KNOWN_FOLDER_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(KNOWN_FOLDER_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 28." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(KNOWN_FOLDER_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA000000B." << endl;
        cout << "   KnownFolderID:                   "; Utils::printSid(KNOWN_FOLDER_PROPS.KnownFolderID, 0);
            cout << " : " << Utils::getClsidType(KNOWN_FOLDER_PROPS.KnownFolderID) << endl;
        cout << "   Offset:                          " << dec << Utils::lenFourBytes(KNOWN_FOLDER_PROPS.Offset) << " bytes." << endl <<
            Utils::defaultOffsetDocInfo << "Specifies the location of the ItemID of the first child segment of the IDList specified by KnownFolderID. " << endl <<
            Utils::defaultOffsetDocInfo << "This value is the offset, in bytes, into the link target IDList." << endl;
    }
    if (propertyStorePropsIsSet) {
        /* PROPERTY_STORE_PROPS struct*/
        cout << "PROPERTY_STORE_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(PROPERTY_STORE_PROPS.BlockSize) << " bytes" << endl <<
        Utils::defaultOffsetDocInfo << "This value MUST be greater than or equal to 12." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(PROPERTY_STORE_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000009." << endl;
        cout << "   PropertyStore:                   " << endl;
        for (int j = 0; j < PROPERTY_STORE_PROPS.PropertyStore.size(); ++j) {
            cout << "   Serialized Property Storage " << j+1 << endl;
            cout << "          StorageSize:              " << dec << Utils::lenFourBytes(PROPERTY_STORE_PROPS.PropertyStore[j].StorageSize)
                 << " bytes" << endl;
            cout << "          Version:                  "; Utils::print_vec(PROPERTY_STORE_PROPS.PropertyStore[j].Version);
            cout << Utils::defaultOffsetDocInfo << "Has to be equal to 0x53505331." << endl;
            cout << "          FormatID:                 ";  Utils::printSid(PROPERTY_STORE_PROPS.PropertyStore[j].FormatID, 0);
            cout << " : " << Utils::getClsidType(PROPERTY_STORE_PROPS.PropertyStore[j].FormatID) << endl;

            for (int i = 0; i < PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue.size(); ++i) {
                cout << "          SerializedPropertyValue " << i + 1 << ":" << endl;
                cout << "            ValueSize:              " << dec <<
                     Utils::lenFourBytes(PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].ValueSize)  << " bytes" << endl;
                if (isStringNameStructInPropsStorage) {
                    /* for StringName */
                    cout << "            NameSize:               "  << dec <<
                         Utils::lenFourBytes(PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].NameSizeOrId) << " bytes" << endl;
                } else {
                    /* for IntegerName */
                    cout << "            Id:                     " << dec <<
                         Utils::lenFourBytes(PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].NameSizeOrId) << endl;
                }
                cout << "            Reserved:               ";
                Utils::print_vec(PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].Reserved);
                    cout << Utils::defaultOffsetDocInfo << "MUST be 0x00." << endl;
                if (isStringNameStructInPropsStorage) {
                    /* for StringName */
                    cout << "            Name:               ";
                    Utils::print_vec_unicode(PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].Name);
                }
                cout << "            Value (TypedPropertyValue structure):" << endl;
                cout << "              Type:                 ";
                ExtraData::parseTypedPropertyValueTypeAndValue(true, Utils::vectTwoToUnsignedInt(
                                                    PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].Value.Type, 0),
                                                    PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].Value);
                cout << "              Padding:              ";
                Utils::print_vec(PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].Value.Padding);
                cout << Utils::defaultOffsetDocInfo << "MUST be set to zero, and any nonzero value SHOULD be rejected." << endl;
            }
            cout << "          TerminalIdentifier:       ";
            Utils::print_vec(PROPERTY_STORE_PROPS.PropertyStore[j].TerminalIdentifier);
        }
        cout << "   TerminalId:                      "; Utils::print_vec(PROPERTY_STORE_PROPS.TerminalId);
    }
    if (shimPropsIsSet) {
        /* SHIM_PROPS struct*/
        cout << "SHIM_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(SHIM_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be greater than or equal to 136." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(SHIM_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000008." << endl;
        cout << "   LayerName:                       "; Utils::print_vec_unicode(SHIM_PROPS.LayerName);
    }
    if (sFolderPropsIsSet) { // Проверена
        /* SPECIAL_FOLDER_PROPS struct*/
        cout << "SPECIAL_FOLDER_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(SPECIAL_FOLDER_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 16." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(SPECIAL_FOLDER_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000005." << endl;
        cout << "   SpecialFolderID:                 " << dec << Utils::lenFourBytes(SPECIAL_FOLDER_PROPS.SpecialFolderID) <<  " : " <<
            ExtraData::getSpecialFolderType(Utils::vectFourBytesToUnsignedInt(SPECIAL_FOLDER_PROPS.SpecialFolderID, 0)) << endl;
        cout << "   Offset:                          " << dec << Utils::lenFourBytes(SPECIAL_FOLDER_PROPS.Offset) << " bytes." << endl <<
            Utils::defaultOffsetDocInfo << "Specifies the location of the ItemID of the first child segment of the IDList specified by SpecialFolderID. " << endl <<
            Utils::defaultOffsetDocInfo << "This value is the offset, in bytes, into the link target IDList." << endl;
    }
    if (trackerPropsIsSet) {
        /* TRACKER_PROPS struct*/
        cout << "TRACKER_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(TRACKER_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 96." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(TRACKER_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000003." << endl;
        cout << "   Length:                          "  << dec << Utils::lenFourBytes(TRACKER_PROPS.Length) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 88 bytes." << endl;
        cout << "   Version:                         " << dec << Utils::lenFourBytes(TRACKER_PROPS.Version) << endl;
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0." << endl;
        cout << "   MachineID (NetBIOS name):        "; Utils::print_vec_unicode(TRACKER_PROPS.MachineID);
        cout << "   Droid:                           " << endl;
        cout << "     Droid volume identifier:       "; Utils::printSid(TRACKER_PROPS.Droid, 16); cout << endl;
        cout << "     Droid file identifier:         "; Utils::printSid(TRACKER_PROPS.Droid, 0); cout << endl;
        cout << "     UUID Sequence number:          " << dec << Utils::vectTwoToUnsignedInt(TRACKER_PROPS.Droid, 24) << endl;
        cout << "     Mac address:                   "; Utils::printMacAddr(TRACKER_PROPS.Droid, 16);
        cout << "   DroidBirth:                      " << endl;
        cout << "     Birth droid volume identifier: "; Utils::printSid(TRACKER_PROPS.DroidBirth, 16); cout << endl;
        cout << "     Birth droid file identifier:   "; Utils::printSid(TRACKER_PROPS.DroidBirth, 0); cout << endl;
    }
    if (vistaAndAboveIDListPropsIsSet) {
        /* VISTA_AND_ABOVE_IDLIST_PROPS struct*/
        cout << "VISTA_AND_ABOVE_IDLIST_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec
            << Utils::lenFourBytes(VISTA_AND_ABOVE_IDLIST_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be greater than or equal to 10." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(VISTA_AND_ABOVE_IDLIST_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA000000C." << endl;
        cout << "   IDList: " <<  endl;
        for(int i = 0; i < VISTA_AND_ABOVE_IDLIST_PROPS.IDList.size(); ++i){
            cout << "       ItemID " << i + 1 << endl;
            cout << "           ItemIDSize:              " << dec
                 << Utils::lenTwoBytes(VISTA_AND_ABOVE_IDLIST_PROPS.IDList[i].ItemIDSize) << " bytes" << endl;
            cout << "           Data:                    "; Utils::parseItemData(VISTA_AND_ABOVE_IDLIST_PROPS.IDList[i].Data);
        }
        cout << "           TerminalID:              "; Utils::print_vec(VISTA_AND_ABOVE_IDLIST_PROPS.TerminalID);
    }
    cout << "TerminalBlock:                      "; Utils::print_vec(TerminalBlock);
    cout << "_________________________________________________________" << endl;
}